

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

void nghttp2_stream_reschedule(nghttp2_stream *stream)

{
  uint64_t uVar1;
  nghttp2_stream *local_18;
  nghttp2_stream *dep_stream;
  nghttp2_stream *stream_local;
  
  if (stream->queued != '\0') {
    dep_stream = stream;
    for (local_18 = stream->dep_prev; local_18 != (nghttp2_stream *)0x0;
        local_18 = local_18->dep_prev) {
      nghttp2_pq_remove(&local_18->obq,&dep_stream->pq_entry);
      stream_next_cycle(dep_stream,local_18->descendant_last_cycle);
      uVar1 = local_18->descendant_next_seq;
      local_18->descendant_next_seq = uVar1 + 1;
      dep_stream->seq = uVar1;
      nghttp2_pq_push(&local_18->obq,&dep_stream->pq_entry);
      local_18->last_writelen = dep_stream->last_writelen;
      dep_stream = local_18;
    }
    return;
  }
  __assert_fail("stream->queued",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_stream.c"
                ,0xe5,"void nghttp2_stream_reschedule(nghttp2_stream *)");
}

Assistant:

void nghttp2_stream_reschedule(nghttp2_stream *stream) {
  nghttp2_stream *dep_stream;

  assert(stream->queued);

  dep_stream = stream->dep_prev;

  for (; dep_stream; stream = dep_stream, dep_stream = dep_stream->dep_prev) {
    nghttp2_pq_remove(&dep_stream->obq, &stream->pq_entry);

    stream_next_cycle(stream, dep_stream->descendant_last_cycle);
    stream->seq = dep_stream->descendant_next_seq++;

    nghttp2_pq_push(&dep_stream->obq, &stream->pq_entry);

    DEBUGF("stream: stream=%d obq resched cycle=%lu\n", stream->stream_id,
           stream->cycle);

    dep_stream->last_writelen = stream->last_writelen;
  }
}